

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed32
          (UnknownFieldLiteParserHelper *this,uint32 num,uint32 value)

{
  uint32 in_EDX;
  long *in_RDI;
  char buffer [4];
  string *in_stack_ffffffffffffffd8;
  uint8 local_14 [4];
  uint32 local_10;
  
  if (*in_RDI != 0) {
    local_10 = in_EDX;
    WriteVarint((uint64)in_RDI,in_stack_ffffffffffffffd8);
    io::CodedOutputStream::WriteLittleEndian32ToArray(local_10,local_14);
    std::__cxx11::string::append((char *)*in_RDI,(ulong)local_14);
  }
  return;
}

Assistant:

void AddFixed32(uint32 num, uint32 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 5, unknown_);
    char buffer[4];
    io::CodedOutputStream::WriteLittleEndian32ToArray(
        value, reinterpret_cast<uint8*>(buffer));
    unknown_->append(buffer, 4);
  }